

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.h
# Opt level: O0

void __thiscall
TPZFrontMatrix<std::complex<double>,_TPZStackEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
::CopyFrom(TPZFrontMatrix<std::complex<double>,_TPZStackEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
           *this,TPZMatrix<std::complex<double>_> *mat)

{
  TPZFrontMatrix<std::complex<double>,_TPZStackEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
  *this_00;
  long in_RSI;
  TPZFrontMatrix<std::complex<double>,_TPZStackEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
  *from;
  size_t in_stack_000003e8;
  char *in_stack_000003f0;
  TPZFrontMatrix<std::complex<double>,_TPZStackEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
  *in_stack_ffffffffffffffc8;
  
  if (in_RSI == 0) {
    this_00 = (TPZFrontMatrix<std::complex<double>,_TPZStackEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
               *)0x0;
  }
  else {
    this_00 = (TPZFrontMatrix<std::complex<double>,_TPZStackEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
               *)__dynamic_cast(in_RSI,&TPZMatrix<std::complex<double>>::typeinfo,
                                &TPZFrontMatrix<std::complex<double>,TPZStackEqnStorage<std::complex<double>>,TPZFrontSym<std::complex<double>>>
                                 ::typeinfo,0);
  }
  if (this_00 ==
      (TPZFrontMatrix<std::complex<double>,_TPZStackEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
       *)0x0) {
    std::operator<<((ostream *)&std::cerr,
                    "virtual void TPZFrontMatrix<std::complex<double>, TPZStackEqnStorage<std::complex<double>>, TPZFrontSym<std::complex<double>>>::CopyFrom(const TPZMatrix<TVar> *) [TVar = std::complex<double>, store = TPZStackEqnStorage<std::complex<double>>, front = TPZFrontSym<std::complex<double>>]"
                   );
    std::operator<<((ostream *)&std::cerr,"\nERROR: Called with incompatible type\n.");
    std::operator<<((ostream *)&std::cerr,"Aborting...\n");
    pzinternal::DebugStopImpl(in_stack_000003f0,in_stack_000003e8);
  }
  else {
    operator=(this_00,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void CopyFrom(const TPZMatrix<TVar> *  mat) override        
  {                                                           
    auto *from = dynamic_cast<const TPZFrontMatrix<TVar,store,front> *>(mat);                
    if (from) {                                               
      *this = *from;                                          
    }                                                         
    else                                                      
      {                                                       
        PZError<<__PRETTY_FUNCTION__;                         
        PZError<<"\nERROR: Called with incompatible type\n."; 
        PZError<<"Aborting...\n";                             
        DebugStop();                                          
      }                                                       
  }